

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_GetOrderedByLevels::_Run(_Test_GetOrderedByLevels *this)

{
  bool bVar1;
  allocator local_9e9;
  Snapshot local_9e8 [4];
  undefined1 local_9c8 [448];
  undefined1 local_808 [16];
  Snapshot local_7f8 [4];
  undefined1 local_7d8 [455];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [32];
  undefined1 local_5c8 [431];
  allocator local_419;
  Snapshot local_418 [4];
  undefined1 local_3f8 [448];
  Slice local_238;
  Slice local_228;
  allocator local_211;
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [424];
  _Test_GetOrderedByLevels *local_10;
  _Test_GetOrderedByLevels *this_local;
  
  local_10 = this;
  do {
    test::Tester::Tester
              ((Tester *)(local_1b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2c6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"foo",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"v1",&local_211);
    DBTest::Put((DBTest *)local_1b8,(string *)this,(string *)local_1d8);
    test::Tester::IsOk((Tester *)(local_1b8 + 8),(Status *)local_1b8);
    Status::~Status((Status *)local_1b8);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    test::Tester::~Tester((Tester *)(local_1b8 + 8));
    Slice::Slice(&local_228,"a");
    Slice::Slice(&local_238,"z");
    DBTest::Compact(&this->super_DBTest,&local_228,&local_238);
    test::Tester::Tester
              ((Tester *)(local_3f8 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_418,"foo",&local_419);
    DBTest::Get((DBTest *)local_3f8,(string *)this,local_418);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_3f8 + 0x20),(char (*) [3])"v1",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8);
    std::__cxx11::string::~string((string *)local_3f8);
    std::__cxx11::string::~string((string *)local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    test::Tester::~Tester((Tester *)(local_3f8 + 0x20));
    test::Tester::Tester
              ((Tester *)(local_5c8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e8,"foo",&local_5e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_610,"v2",&local_611);
    DBTest::Put((DBTest *)local_5c8,(string *)this,(string *)local_5e8);
    test::Tester::IsOk((Tester *)(local_5c8 + 8),(Status *)local_5c8);
    Status::~Status((Status *)local_5c8);
    std::__cxx11::string::~string(local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    std::__cxx11::string::~string(local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    test::Tester::~Tester((Tester *)(local_5c8 + 8));
    test::Tester::Tester
              ((Tester *)(local_7d8 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2ca);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_7f8,"foo",(allocator *)(local_808 + 0xf));
    DBTest::Get((DBTest *)local_7d8,(string *)this,local_7f8);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_7d8 + 0x20),(char (*) [3])"v2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d8);
    std::__cxx11::string::~string((string *)local_7d8);
    std::__cxx11::string::~string((string *)local_7f8);
    std::allocator<char>::~allocator((allocator<char> *)(local_808 + 0xf));
    test::Tester::~Tester((Tester *)(local_7d8 + 0x20));
    DBTest::dbfull(&this->super_DBTest);
    DBImpl::TEST_CompactMemTable((DBImpl *)local_808);
    Status::~Status((Status *)local_808);
    test::Tester::Tester
              ((Tester *)(local_9c8 + 0x20),
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x2cc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_9e8,"foo",&local_9e9);
    DBTest::Get((DBTest *)local_9c8,(string *)this,local_9e8);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)(local_9c8 + 0x20),(char (*) [3])"v2",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c8);
    std::__cxx11::string::~string((string *)local_9c8);
    std::__cxx11::string::~string((string *)local_9e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
    test::Tester::~Tester((Tester *)(local_9c8 + 0x20));
    bVar1 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar1);
  return;
}

Assistant:

TEST(DBTest, GetOrderedByLevels) {
  do {
    ASSERT_OK(Put("foo", "v1"));
    Compact("a", "z");
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_OK(Put("foo", "v2"));
    ASSERT_EQ("v2", Get("foo"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v2", Get("foo"));
  } while (ChangeOptions());
}